

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot returnValueRegister,
          RegSlot functionRegister,ArgSlot givenArgCount,AsmJsRetType retType)

{
  Data *this_00;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  Which WVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  AsmJsRetType local_28;
  undefined1 local_24;
  undefined1 local_23 [3];
  AsmJsRetType retType_local;
  OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_015b5fbd == '\0') && (DAT_015b5fbc == '\0')) &&
     ((int)(char)returnValueRegister == returnValueRegister)) {
    local_23[2] = (undefined1)((ulong)in_RAX >> 0x38);
    if (functionRegister < 0x100) {
      _local_28 = CONCAT35(CONCAT12(local_23[2],
                                    CONCAT11((char)functionRegister,(char)returnValueRegister)),
                           CONCAT14((char)givenArgCount,retType.which_));
      if (((givenArgCount < 0x100) && (WVar4 = AsmJsRetType::which(&local_28), DAT_015b5fbd == '\0')
          ) && (DAT_015b5fbc == '\0')) {
        _local_28 = CONCAT17((char)WVar4,_local_28);
        bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                      ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                      "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
        ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>
                  (this_00,op,&this->super_ByteCodeWriter);
        if ((ushort)(op - StartCall) < 0xfff8) {
          puVar1 = &(this->super_ByteCodeWriter).m_byteCodeWithoutLDACount;
          *puVar1 = *puVar1 + 1;
        }
        ByteCodeWriter::IncreaseByteCodeCount(&this->super_ByteCodeWriter);
        ByteCodeWriter::Data::Write(this_00,&local_24,4);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmCall(OpCodeAsmJs op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, AsmJsRetType retType)
    {
        OpLayoutT_AsmCall<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::template Assign<int8>(layout.ReturnType, (int8)retType.which()))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }